

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O2

gnode_t * get_enclosing(gravity_parser_t *parser,gnode_n tag)

{
  gnode_r *pgVar1;
  ulong uVar2;
  gnode_t *pgVar3;
  ulong uVar4;
  
  pgVar1 = parser->declarations;
  if ((pgVar1 == (gnode_r *)0x0) || (uVar2 = pgVar1->n, (int)uVar2 == 0)) {
    return (gnode_t *)0x0;
  }
  uVar4 = uVar2 & 0xffffffff;
  do {
    uVar4 = uVar4 - 1;
    if ((int)uVar4 + 1 < 1) {
      return (gnode_t *)0x0;
    }
    if (uVar2 <= uVar4) {
      return (gnode_t *)0x0;
    }
    pgVar3 = pgVar1->p[uVar4];
    if (pgVar3 == (gnode_t *)0x0) {
      return (gnode_t *)0x0;
    }
  } while (pgVar3->tag != tag);
  return pgVar3;
}

Assistant:

static gnode_t *get_enclosing (gravity_parser_t *parser, gnode_n tag) {
    int32_t n = (int32_t)gnode_array_size(parser->declarations);
    if (!n) return NULL;

    --n;
    while (n >= 0) {
        gnode_t *decl = gnode_array_get(parser->declarations, n);
        if (!decl) return NULL;
        if (decl->tag == tag) return decl;
        --n;
    }

    return NULL;
}